

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O2

uint __thiscall
ON_SubDQuadNeighborhood::SetLimitSubSurfaceExactCVs
          (ON_SubDQuadNeighborhood *this,bool bEnableApproximatePatch,uint quadrant_index)

{
  ON_SubDEdge **ppOVar1;
  ON_SubDFace *pOVar2;
  ON_SubDVertex *this_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double (*paadVar8) [5] [3];
  double (*paadVar9) [5] [3];
  bool bVar10;
  uint i;
  int iVar11;
  int iVar12;
  long lVar13;
  double *pdVar14;
  double (*extraout_RAX) [3];
  double (*padVar15) [3];
  char *pcVar16;
  double *pdVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  double (*padVar22) [3];
  int iVar23;
  undefined7 in_register_00000031;
  long lVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  int iVar28;
  long lVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  long lStack_230;
  undefined1 auStack_218 [4];
  undefined4 local_214;
  double (*local_210) [5] [3];
  double local_208 [5];
  double local_1e0;
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  uint local_1bc;
  undefined4 local_1b8;
  uint local_1b4;
  ulong local_1b0;
  ulong local_1a8;
  uint local_1a0;
  int local_19c;
  ON_SubDFace *(*local_198) [3];
  ON_SubDEdge *(*local_190) [2];
  double (*local_188 [4]) [3];
  double *local_168;
  double *local_160;
  double *local_158;
  double *local_150;
  double *local_148;
  double *local_140;
  double *local_138;
  double *local_130;
  double *local_128;
  double *local_120;
  double *local_118;
  double *local_110;
  double *local_108;
  double *local_100;
  double *local_f8;
  double *local_f0;
  double *local_e8;
  double *local_e0;
  double *local_d8;
  double *local_d0;
  double *local_c8;
  double *local_c0;
  double *local_b8;
  double *local_b0;
  ulong local_a8;
  double *local_a0;
  ON_2dex srf_cv_dex [8];
  ON_SubDVertex *local_58 [5];
  
  pcVar16 = (char *)0x0;
  local_214 = 0;
  padVar15 = (double (*) [3])(ulong)this->m_current_subdivision_level;
  if (this->m_current_subdivision_level <= this->m_initial_subdivision_level) {
    padVar15 = (double (*) [3])pcVar16;
  }
  local_1b8 = (int)padVar15;
  if (((int)CONCAT71(in_register_00000031,bEnableApproximatePatch) != 0) &&
     ((local_1b8._0_1_ = (byte)padVar15, (byte)local_1b8 < 2 ||
      (local_214 = 1, 1 < this->m_extraordinary_corner_vertex_count)))) {
    ON_SubDIncrementErrorCount();
    pcVar16 = "bEnableApproximatePatch should be false at this stage.";
    local_214 = 0;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_limit.cpp"
               ,0x543,"","bEnableApproximatePatch should be false at this stage.");
  }
  pOVar2 = this->m_face_grid[1][1];
  if (((pOVar2 != (ON_SubDFace *)0x0) && (quadrant_index < 5)) && (pOVar2->m_edge_count == 4)) {
    local_198 = this->m_face_grid;
    local_58[0] = this->m_vertex_grid[1][1];
    local_58[1] = this->m_vertex_grid[2][1];
    local_58[2] = this->m_vertex_grid[2][2];
    local_58[3] = this->m_vertex_grid[1][2];
    lVar29 = 0;
    while (lVar29 != 4) {
      if ((local_58[lVar29] == (ON_SubDVertex *)0x0) ||
         (ppOVar1 = this->m_center_edges + lVar29, lVar29 = lVar29 + 1,
         *ppOVar1 == (ON_SubDEdge *)0x0)) goto LAB_0061b1de;
    }
    local_210 = this->m_srf_cv1;
    bVar10 = ON_IsValid(this->m_srf_cv1[2][2][0]);
    if (bVar10) goto LAB_0061a555;
    bVar10 = ON_SubDFace::GetSubdivisionPoint(this->m_face_grid[1][1],&local_1d8);
    if (bVar10) {
      ON_2dex::ON_2dex(srf_cv_dex,1,1);
      ON_2dex::ON_2dex(srf_cv_dex + 1,2,1);
      ON_2dex::ON_2dex(srf_cv_dex + 2,3,1);
      ON_2dex::ON_2dex(srf_cv_dex + 3,3,2);
      ON_2dex::ON_2dex(srf_cv_dex + 4,3,3);
      ON_2dex::ON_2dex(srf_cv_dex + 5,2,3);
      ON_2dex::ON_2dex(srf_cv_dex + 6,1,3);
      ON_2dex::ON_2dex(srf_cv_dex + 7,1,2);
      lVar29 = 0;
      padVar15 = extraout_RAX;
      goto LAB_0061b12d;
    }
  }
LAB_0061b1de:
  ON_SubDIncrementErrorCount();
  return 0;
LAB_0061b12d:
  if (lVar29 == 0x20) goto LAB_0061b206;
  bVar10 = ON_SubDVertex::GetSubdivisionPoint
                     (*(ON_SubDVertex **)((long)local_58 + lVar29),local_208);
  if ((!bVar10) ||
     (bVar10 = ON_SubDEdge::GetSubdivisionPoint
                         (*(ON_SubDEdge **)((long)this->m_center_edges + lVar29),local_208 + 3),
     !bVar10)) goto LAB_0061b1de;
  iVar28 = *(int *)((long)&srf_cv_dex[0].i + lVar29 * 2);
  iVar12 = *(int *)((long)&srf_cv_dex[0].j + lVar29 * 2);
  padVar15 = local_210[iVar28] + iVar12;
  local_210[iVar28][iVar12][0] = local_208[0];
  local_210[iVar28][iVar12][1] = local_208[1];
  local_210[iVar28][iVar12][2] = local_208[2];
  iVar28 = *(int *)((long)&srf_cv_dex[1].i + lVar29 * 2);
  iVar12 = *(int *)((long)&srf_cv_dex[1].j + lVar29 * 2);
  pcVar16 = (char *)(local_210[iVar28] + iVar12);
  local_210[iVar28][iVar12][0] = local_208[3];
  local_210[iVar28][iVar12][1] = local_208[4];
  local_210[iVar28][iVar12][2] = local_1e0;
  lVar29 = lVar29 + 8;
  goto LAB_0061b12d;
LAB_0061b206:
  this->m_srf_cv1[2][2][0] = local_1d8;
  this->m_srf_cv1[2][2][1] = dStack_1d0;
  this->m_srf_cv1[2][2][2] = local_1c8;
  local_188[0] = padVar15;
  local_188[1] = (double (*) [3])pcVar16;
  local_188[2] = this->m_srf_cv1[2] + 2;
LAB_0061a555:
  uVar18 = quadrant_index;
  if (quadrant_index == 4) {
    uVar18 = 0;
  }
  uVar27 = (ulong)uVar18;
  local_a8 = (ulong)(quadrant_index + 1);
  if (quadrant_index == 4) {
    local_a8 = 4;
  }
  local_190 = this->m_edge_grid;
  local_f0 = this->m_srf_cv1[0][3] + 1;
  local_f8 = this->m_srf_cv1[0][3] + 2;
  local_100 = this->m_srf_cv1[3][4] + 1;
  local_108 = this->m_srf_cv1[3][4] + 2;
  local_110 = this->m_srf_cv1[4][1] + 1;
  local_118 = this->m_srf_cv1[4][1] + 2;
  local_120 = this->m_srf_cv1[1][0] + 1;
  local_128 = this->m_srf_cv1[1][0] + 2;
  local_130 = this->m_srf_cv1[1][4] + 1;
  local_138 = this->m_srf_cv1[1][4] + 2;
  local_140 = this->m_srf_cv1[4][3] + 1;
  local_148 = this->m_srf_cv1[4][3] + 2;
  local_150 = this->m_srf_cv1[3][0] + 1;
  local_158 = this->m_srf_cv1[3][0] + 2;
  local_160 = this->m_srf_cv1[0][1] + 1;
  local_168 = this->m_srf_cv1[0][1] + 2;
  local_b0 = this->m_srf_cv1[1][2] + 1;
  local_b8 = this->m_srf_cv1[1][2] + 2;
  local_c0 = this->m_srf_cv1[2][3] + 1;
  local_c8 = this->m_srf_cv1[2][3] + 2;
  local_d0 = this->m_srf_cv1[3][2] + 1;
  local_d8 = this->m_srf_cv1[3][2] + 2;
  local_e0 = this->m_srf_cv1[2][1] + 1;
  local_e8 = this->m_srf_cv1[2][1] + 2;
  local_a0 = this->m_srf_cv1[0][0] + 2;
  local_1bc = 0;
  uVar18 = 0;
  do {
    if (local_a8 <= uVar27) {
      if (uVar18 < local_1bc) {
        ON_SubDIncrementErrorCount();
      }
      return uVar18;
    }
    if (this->m_bExactQuadrantPatch[uVar27] == true) {
      local_1bc = local_1bc + 1;
LAB_0061a729:
      local_1a8 = (ulong)((int)uVar27 - 1U & 3);
      iVar28 = 9;
      iVar12 = 0;
      local_1b0 = uVar27;
      local_1a0 = uVar18;
      while (iVar25 = (int)uVar27, iVar12 != 2) {
        uVar21 = local_1a8;
        if (iVar12 == 0) {
          uVar21 = uVar27;
        }
        local_1b4 = (int)uVar21 - 1;
        iVar11 = 0;
        iVar25 = 1;
        uVar27 = 1;
        iVar23 = 0;
        iVar26 = iVar25;
        if (local_1b4 < 3) {
          uVar19 = (ulong)local_1b4;
          iVar25 = *(int *)(&DAT_006cc7cc + uVar19 * 4);
          uVar27 = *(ulong *)(&DAT_006cc5b0 + uVar19 * 8);
          iVar11 = *(int *)(&DAT_006cc5c8 + uVar19 * 4);
          iVar26 = *(int *)(&DAT_006cc5d4 + uVar19 * 4);
          iVar23 = 2 - (int)uVar21;
        }
        uVar18 = (uint)uVar27 & 7;
        local_188[0] = local_210[uVar18] + (uVar27 >> 0x20);
        paadVar8 = local_210 + (iVar25 + iVar26);
        paadVar9 = local_210 + (iVar25 + iVar26 + iVar26);
        local_19c = iVar12;
        local_188[1] = *paadVar8 + (iVar11 + iVar23);
        local_188[2] = *paadVar9 + (iVar11 + iVar23 + iVar23);
        bVar10 = ON_IsValid(local_210[uVar18][uVar27 >> 0x20][0]);
        if (((bVar10) && (bVar10 = ON_IsValid((*paadVar8)[iVar11 + iVar23][0]), bVar10)) &&
           (bVar10 = ON_IsValid((*paadVar9)[iVar11 + iVar23 + iVar23][0]), bVar10)) {
          iVar28 = iVar28 + 3;
          uVar27 = local_1b0;
        }
        else {
          uVar21 = uVar21 & 0xffffffff;
          if ((char)local_214 == '\0') {
            if (this->m_bBoundaryCrease[uVar21] == true) goto LAB_0061a8e6;
LAB_0061a87c:
            uVar27 = local_1b0;
            if ((((byte)local_1b8 < 2) && (this->m_bExactQuadrantPatch[local_1b0] == false)) ||
               (bVar10 = ON_SubDEdge::IsSmoothNotX(this->m_center_edges[uVar21]), !bVar10))
            goto LAB_0061aabf;
            if (local_190[uVar21][0] == (ON_SubDEdge *)0x0) {
              if (this->m_bExactQuadrantPatch[uVar27] == true) goto LAB_0061b1de;
              local_208[0] = -1.23432101234321e+308;
            }
            else {
              bVar10 = ON_SubDEdge::GetSubdivisionPoint(local_190[uVar21][0],local_208);
              if (!bVar10) goto LAB_0061b1de;
            }
            if (local_1b4 < 3) {
              lVar13 = 2 - (ulong)local_1b4;
              lVar29 = *(long *)(&DAT_006cc5f8 + (ulong)local_1b4 * 8);
            }
            else {
              lVar13 = 1;
              lVar29 = 0;
            }
            if (local_198[lVar13][lVar29] == (ON_SubDFace *)0x0) {
              if (this->m_bExactQuadrantPatch[uVar27] == true) goto LAB_0061b1de;
              local_208[3] = -1.23432101234321e+308;
            }
            else {
              bVar10 = ON_SubDFace::GetSubdivisionPoint(local_198[lVar13][lVar29],local_208 + 3);
              if (!bVar10) goto LAB_0061b1de;
            }
            if (local_190[uVar21][1] == (ON_SubDEdge *)0x0) {
              if (this->m_bExactQuadrantPatch[uVar27] == true) goto LAB_0061b1de;
              local_1d8 = -1.23432101234321e+308;
            }
            else {
              bVar10 = ON_SubDEdge::GetSubdivisionPoint(local_190[uVar21][1],&local_1d8);
              if (!bVar10) goto LAB_0061b1de;
            }
          }
          else {
            bVar10 = ON_SubDEdge::IsCrease(this->m_center_edges[uVar21]);
            if (!bVar10) goto LAB_0061a87c;
LAB_0061a8e6:
            uVar27 = local_1b0;
            lVar29 = 1;
            lVar13 = lVar29;
            lVar20 = lVar29;
            uVar19 = 2;
            if (local_1b4 < 3) {
              uVar19 = (ulong)local_1b4;
              lVar29 = *(long *)(&DAT_006cc670 + uVar19 * 8);
              lVar13 = *(long *)(&DAT_006cc688 + uVar19 * 8);
              lVar20 = *(long *)(&DAT_006cc5e0 + uVar19 * 8);
              uVar19 = uVar21;
            }
            pdVar14 = local_a0;
            for (lVar24 = 0x10; lVar24 != 0x58; lVar24 = lVar24 + 0x18) {
              dVar7 = pdVar14[lVar29 * 0xf + lVar13 * 3 + -2];
              dVar6 = (pdVar14 + lVar29 * 0xf + lVar13 * 3 + -2)[1];
              dVar6 = (dVar6 + dVar6) - (pdVar14 + lVar20 * 0xf + uVar19 * 3 + -2)[1];
              auVar3._8_4_ = SUB84(dVar6,0);
              auVar3._0_8_ = (dVar7 + dVar7) - pdVar14[lVar20 * 0xf + uVar19 * 3 + -2];
              auVar3._12_4_ = (int)((ulong)dVar6 >> 0x20);
              *(undefined1 (*) [16])(auStack_218 + lVar24) = auVar3;
              *(double *)((long)local_208 + lVar24) =
                   (pdVar14[lVar29 * 0xf + lVar13 * 3] + pdVar14[lVar29 * 0xf + lVar13 * 3]) -
                   pdVar14[lVar20 * 0xf + uVar19 * 3];
              pdVar14 = pdVar14 + (long)iVar26 * 0xf + (long)iVar23 * 3;
            }
          }
          pdVar14 = local_208;
          for (lVar29 = 0; lVar29 != 3; lVar29 = lVar29 + 1) {
            padVar15 = local_188[lVar29];
            bVar10 = ON_IsValid((*padVar15)[0]);
            if (bVar10) {
              iVar28 = iVar28 + 1;
            }
            else {
              bVar10 = ON_IsValid(*pdVar14);
              if (bVar10) {
                iVar28 = iVar28 + 1;
                (*padVar15)[0] = *pdVar14;
                (*padVar15)[1] = pdVar14[1];
                (*padVar15)[2] = pdVar14[2];
              }
            }
            pdVar14 = pdVar14 + 3;
          }
        }
LAB_0061aabf:
        iVar12 = local_19c + 1;
      }
      if ((this->m_bExactQuadrantPatch[uVar27] != false) ||
         ((char)local_214 == '\x01' && this->m_bExtraordinaryCornerVertex[uVar27] == false)) {
        uVar18 = iVar25 - 1;
        if (uVar18 < 3) {
          lVar29 = *(long *)(&DAT_006cc610 + (ulong)uVar18 * 8);
          lVar13 = *(long *)(&DAT_006cc628 + (ulong)uVar18 * 8);
        }
        else {
          lVar29 = 0;
          lVar13 = 0;
        }
        padVar15 = local_210[lVar29] + lVar13;
        local_188[0] = padVar15;
        bVar10 = ON_IsValid(local_210[lVar29][lVar13][0]);
        if (bVar10) {
          iVar28 = iVar28 + 1;
        }
        else {
          this_00 = local_58[uVar27];
          bVar10 = ON_SubDVertex::IsSmooth(this_00);
          if (bVar10) {
            if ((this_00->m_edge_count == 4) && (this_00->m_face_count == 4)) {
              if (uVar18 < 3) {
                lVar29 = *(long *)(&DAT_006cc640 + (ulong)uVar18 * 8);
                lVar13 = *(long *)(&DAT_006cc658 + (ulong)uVar18 * 8);
              }
              else {
                lVar29 = 0;
                lVar13 = 0;
              }
              if ((local_198[lVar29][lVar13] == (ON_SubDFace *)0x0) ||
                 (bVar10 = ON_SubDFace::GetSubdivisionPoint(local_198[lVar29][lVar13],local_208),
                 !bVar10)) goto LAB_0061b1de;
              (*padVar15)[0] = local_208[0];
              (*padVar15)[1] = local_208[1];
              dVar6 = local_208[2];
LAB_0061ac68:
              iVar28 = iVar28 + 1;
              (*padVar15)[2] = dVar6;
            }
          }
          else {
            bVar10 = ON_SubDVertex::IsCrease(this_00);
            if (bVar10) {
              if (this->m_bBoundaryCrease[uVar27] == true) {
                if (this->m_bBoundaryCrease[local_1a8] != true) {
                  if (this->m_bBoundaryCrease[local_1a8] != false) goto LAB_0061ac7b;
                  if (iVar25 != 3) {
                    if (iVar25 != 2) {
                      if (iVar25 == 1) {
                        local_208[0] = this->m_srf_cv1[3][0][0];
                        uVar30 = SUB84(local_208[0],0);
                        uVar31 = (undefined4)((ulong)local_208[0] >> 0x20);
                        pdVar14 = local_150;
                        pdVar17 = local_158;
                        goto LAB_0061af68;
                      }
                      local_208[0] = this->m_srf_cv1[0][1][0];
                      uVar30 = SUB84(local_208[0],0);
                      uVar31 = (undefined4)((ulong)local_208[0] >> 0x20);
                      pdVar14 = local_160;
                      pdVar17 = local_168;
                      goto LAB_0061afdd;
                    }
                    local_208[0] = this->m_srf_cv1[4][3][0];
                    uVar30 = SUB84(local_208[0],0);
                    uVar31 = (undefined4)((ulong)local_208[0] >> 0x20);
                    pdVar14 = local_140;
                    pdVar17 = local_148;
LAB_0061af8e:
                    lVar29 = 4;
                    goto LAB_0061afdf;
                  }
                  local_208[0] = this->m_srf_cv1[1][4][0];
                  uVar30 = SUB84(local_208[0],0);
                  uVar31 = (undefined4)((ulong)local_208[0] >> 0x20);
                  pdVar14 = local_130;
                  pdVar17 = local_138;
LAB_0061afb7:
                  lVar29 = 2;
                  lStack_230 = 4;
                  goto LAB_0061afe2;
                }
                if (iVar25 == 3) {
                  local_208[0] = this->m_srf_cv1[1][2][0];
                  uVar30 = SUB84(local_208[0],0);
                  uVar31 = (undefined4)((ulong)local_208[0] >> 0x20);
                  lVar29 = 2;
                  lStack_230 = 3;
                  pdVar14 = local_b0;
                  pdVar17 = local_b8;
                }
                else {
                  if (iVar25 == 2) {
                    local_208[0] = this->m_srf_cv1[2][3][0];
                    uVar30 = SUB84(local_208[0],0);
                    uVar31 = (undefined4)((ulong)local_208[0] >> 0x20);
                    lStack_230 = 3;
                    pdVar14 = local_c0;
                    pdVar17 = local_c8;
                  }
                  else {
                    if (iVar25 == 1) {
                      local_208[0] = this->m_srf_cv1[3][2][0];
                      uVar30 = SUB84(local_208[0],0);
                      uVar31 = (undefined4)((ulong)local_208[0] >> 0x20);
                      lVar29 = 2;
                      lStack_230 = 1;
                      pdVar14 = local_d0;
                      pdVar17 = local_d8;
                      goto LAB_0061adcd;
                    }
                    local_208[0] = this->m_srf_cv1[2][1][0];
                    uVar30 = SUB84(local_208[0],0);
                    uVar31 = (undefined4)((ulong)local_208[0] >> 0x20);
                    lStack_230 = 1;
                    pdVar14 = local_e0;
                    pdVar17 = local_e8;
                  }
                  lVar29 = lStack_230;
                  lStack_230 = 2;
                }
LAB_0061adcd:
                local_208[1] = *pdVar14;
                local_208[2] = *pdVar17;
                local_208[3] = local_210[lVar29][lStack_230][0];
                local_208[4] = local_210[lVar29][lStack_230][1];
                local_1e0 = local_210[lVar29][lStack_230][2];
                local_1d8 = this->m_srf_cv1[2][2][0];
                dStack_1d0 = this->m_srf_cv1[2][2][1];
                local_1c8 = this->m_srf_cv1[2][2][2];
                bVar10 = ON_IsValid((double)CONCAT44(uVar31,uVar30));
                if (((bVar10) && (bVar10 = ON_IsValid(local_208[3]), bVar10)) &&
                   (bVar10 = ON_IsValid(local_1d8), paadVar8 = local_210, bVar10)) {
                  lVar13 = 1;
                  lVar29 = lVar13;
                  if (uVar18 < 3) {
                    lVar29 = *(long *)(&DAT_006cc670 + (ulong)uVar18 * 8);
                    lVar13 = *(long *)(&DAT_006cc688 + (ulong)uVar18 * 8);
                  }
                  bVar10 = ON_IsValid(local_210[lVar29][lVar13][0]);
                  if (bVar10) {
                    padVar22 = paadVar8[lVar29] + lVar13;
                    dVar6 = (*padVar22)[1] * -8.0 + (local_208[4] + local_208[1]) * 4.0 + dStack_1d0
                    ;
                    auVar4._8_4_ = SUB84(dVar6,0);
                    auVar4._0_8_ = (*padVar22)[0] * -8.0 + (local_208[3] + local_208[0]) * 4.0 +
                                   local_1d8;
                    auVar4._12_4_ = (int)((ulong)dVar6 >> 0x20);
                    *(undefined1 (*) [16])*padVar15 = auVar4;
                    iVar28 = iVar28 + 1;
                    (*padVar15)[2] =
                         (*padVar22)[2] * -8.0 + (local_208[2] + local_1e0) * 4.0 + local_1c8;
                  }
                }
              }
              else {
LAB_0061ac7b:
                if ((this->m_bBoundaryCrease[uVar27] == false) &&
                   (this->m_bBoundaryCrease[local_1a8] == true)) {
                  if (iVar25 == 3) {
                    local_208[0] = this->m_srf_cv1[0][3][0];
                    uVar30 = SUB84(local_208[0],0);
                    uVar31 = (undefined4)((ulong)local_208[0] >> 0x20);
                    pdVar14 = local_f0;
                    pdVar17 = local_f8;
LAB_0061afdd:
                    lVar29 = 0;
LAB_0061afdf:
                    lStack_230 = 2;
                  }
                  else {
                    if (iVar25 == 2) {
                      local_208[0] = this->m_srf_cv1[3][4][0];
                      uVar30 = SUB84(local_208[0],0);
                      uVar31 = (undefined4)((ulong)local_208[0] >> 0x20);
                      pdVar14 = local_100;
                      pdVar17 = local_108;
                      goto LAB_0061afb7;
                    }
                    if (iVar25 == 1) {
                      local_208[0] = this->m_srf_cv1[4][1][0];
                      uVar30 = SUB84(local_208[0],0);
                      uVar31 = (undefined4)((ulong)local_208[0] >> 0x20);
                      pdVar14 = local_110;
                      pdVar17 = local_118;
                      goto LAB_0061af8e;
                    }
                    local_208[0] = this->m_srf_cv1[1][0][0];
                    uVar30 = SUB84(local_208[0],0);
                    uVar31 = (undefined4)((ulong)local_208[0] >> 0x20);
                    pdVar14 = local_120;
                    pdVar17 = local_128;
LAB_0061af68:
                    lVar29 = 2;
                    lStack_230 = 0;
                  }
LAB_0061afe2:
                  local_208[1] = *pdVar14;
                  local_208[2] = *pdVar17;
                  local_208[3] = local_210[lVar29][lStack_230][0];
                  local_208[4] = local_210[lVar29][lStack_230][1];
                  local_1e0 = local_210[lVar29][lStack_230][2];
                  bVar10 = ON_IsValid((double)CONCAT44(uVar31,uVar30));
                  if ((bVar10) && (bVar10 = ON_IsValid(local_208[3]), bVar10)) {
                    dVar6 = (local_208[1] + local_208[1]) - local_208[4];
                    auVar5._8_4_ = SUB84(dVar6,0);
                    auVar5._0_8_ = (local_208[0] + local_208[0]) - local_208[3];
                    auVar5._12_4_ = (int)((ulong)dVar6 >> 0x20);
                    *(undefined1 (*) [16])*padVar15 = auVar5;
                    dVar6 = (local_208[2] + local_208[2]) - local_1e0;
                    goto LAB_0061ac68;
                  }
                }
                else if (this->m_bExactQuadrantPatch[uVar27] == true) {
                  ON_SubDIncrementErrorCount();
                  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_limit.cpp"
                             ,0x661,"","Why is this happening?");
                }
              }
            }
          }
        }
      }
      uVar18 = local_1a0 + (iVar28 == 0x10);
    }
    else if ((char)local_214 != '\0') goto LAB_0061a729;
    uVar27 = uVar27 + 1;
  } while( true );
}

Assistant:

unsigned int ON_SubDQuadNeighborhood::SetLimitSubSurfaceExactCVs(
  bool bEnableApproximatePatch,
  unsigned int quadrant_index
  )
{
  // When subdivision_count >= 2, there should be 3 or 4 or more exact quadrants.
  // When the original SubD face is an n-gon, it is subdivided into quads and m_initial_subdivision_level = 1.
  const unsigned char subdivision_count
    = (m_current_subdivision_level > m_initial_subdivision_level)
    ? m_current_subdivision_level
    : 0;  if (bEnableApproximatePatch && (subdivision_count < 2 || m_extraordinary_corner_vertex_count > 1))
  {
    ON_SUBD_ERROR("bEnableApproximatePatch should be false at this stage.");
    bEnableApproximatePatch = false;
  }

  if (nullptr == m_face_grid[1][1] || 4 != m_face_grid[1][1]->m_edge_count || quadrant_index > 4)
    return ON_SUBD_RETURN_ERROR(0);

  // faces_vertices[] face, in counterclockwise order.  
  // m_center_edges[] are the 4 edges of face in counterclockwise order with 
  // m_center_edges[0] connecting face_vertices[0] and face_vertices[1].
  // However, it may be that face->Vertex(0) != face_vertices[0].
  const ON_SubDVertex* center_vertices[4] = { m_vertex_grid[1][1], m_vertex_grid[2][1], m_vertex_grid[2][2], m_vertex_grid[1][2] };
  for (unsigned int i = 0; i < 4; i++)
  {
    if (nullptr == center_vertices[i])
      return ON_SUBD_RETURN_ERROR(0);
    if (nullptr == m_center_edges[i])
      return ON_SUBD_RETURN_ERROR(0);
  }

  ON_2dex dex;
  ON_2dex deltadex;
  const ON_SubDFace* face;
  unsigned int i;
  double Q[3][3];
  double* P1[3];

  if (!ON_IsValid(m_srf_cv1[2][2][0]))
  {
    // All sub surfaces require inner 3x3 grid of subdivision points
    // In all cases these are the 9 subdivision points of the central quad
    // 9 points
    // = the quad face subdivision point at m_srf_cv1[2][2]
    // + 4 edge subdivision pointsat m_srf_cv1[2][1], m_srf_cv1[3][2], m_srf_cv1[2][3], m_srf_cv1[1][2]
    // + 4 vertex subdivision points at m_srf_cv1[1][1], m_srf_cv1[3][1], m_srf_cv1[3][3], m_srf_cv1[1][3] 
    face = m_face_grid[1][1];

    // The value of m_srf_cv1[2][2][0] is used to determine when the inner 3x3 grid is set, 
    // so its value must be set after the 8 cvs around it are successfully set.
    // The value 
    //   Q[2] = face subd point 
    // is calculated here because if face->GetSubdivisionPoint() fails,
    // nothing below should succeed. The value of Q[2] is assigned to m_srf_cv1[2][2]
    // after the 8 ring points are successfully calculated.
    if (!face->GetSubdivisionPoint(Q[2]))
    {
      return ON_SUBD_RETURN_ERROR(0);
    }


    const ON_2dex srf_cv_dex[8] = { { 1, 1 }, { 2, 1 }, { 3, 1 }, { 3, 2 }, { 3, 3 }, { 2, 3 }, { 1, 3 }, { 1, 2 } };

    for (unsigned int fei = 0; fei < 4; fei++)
    {
      if (!center_vertices[fei]->GetSubdivisionPoint( Q[0]))
        return ON_SUBD_RETURN_ERROR(0);
      if (!m_center_edges[fei]->GetSubdivisionPoint( Q[1]))
        return ON_SUBD_RETURN_ERROR(0);

      dex = srf_cv_dex[2 * fei];
      P1[0] = m_srf_cv1[dex.i][dex.j];
      P1[0][0] = Q[0][0]; P1[0][1] = Q[0][1]; P1[0][2] = Q[0][2];

      dex = srf_cv_dex[2 * fei + 1];
      P1[1] = m_srf_cv1[dex.i][dex.j];
      P1[1][0] = Q[1][0]; P1[1][1] = Q[1][1]; P1[1][2] = Q[1][2];
    }

    // m_srf_cv1[2][2][0] is used to determine when the inner 3x3 grid is set, 
    // so its value must be set after the 8 cvs around it are successfully set.
    P1[2] = m_srf_cv1[2][2];
    P1[2][0] = Q[2][0]; P1[2][1] = Q[2][1]; P1[2][2] = Q[2][2];
  }

  const unsigned int fvi_min = (4 == quadrant_index) ? 0 : quadrant_index;
  const unsigned int fvi_max = (4 == quadrant_index) ? 4 : fvi_min+1;
  unsigned int set_quadrant_count = 0;
  unsigned int exact_quadrant_count = 0;
  for (unsigned int fvi = fvi_min; fvi < fvi_max; fvi++)
  {
    if (m_bExactQuadrantPatch[fvi])
      ++exact_quadrant_count;
    else if (false == bEnableApproximatePatch)
      continue;

    unsigned int set_cv_count = 9; // 3x3 grid is set

    const unsigned int fvi3 = (fvi + 3) % 4;

    for (unsigned int side_pass = 0; side_pass < 2; side_pass++)
    {
      const unsigned int side_fvi = (0 == side_pass) ? fvi : fvi3;

      dex = ON_SubDQuadNeighborhood::GridDex(5, side_fvi, 1, 0);
      deltadex = ON_SubDQuadNeighborhood::DeltaDex(side_fvi, 1, 0);
      P1[0] = &m_srf_cv1[dex.i][dex.j][0];
      dex.i += deltadex.i;
      dex.j += deltadex.j;
      P1[1] = &m_srf_cv1[dex.i][dex.j][0];
      dex.i += deltadex.i;
      dex.j += deltadex.j;
      P1[2] = &m_srf_cv1[dex.i][dex.j][0];
      if (ON_IsValid(P1[0][0]) && ON_IsValid(P1[1][0]) && ON_IsValid(P1[2][0]))
      {
        set_cv_count += 3;
        continue; // Already set
      }

      // m_bBoundaryCrease[] is true if m_center_edges[fvi]->IsCrease() is true AND neither end is a dart vertex.
      // Using bCenterEdgeCrease0 is required to get correct results when bEnableApproximatePatch is true
      const bool bCenterEdgeCrease = bEnableApproximatePatch ? m_center_edges[side_fvi]->IsCrease() : m_bBoundaryCrease[side_fvi];

      if ( bCenterEdgeCrease )
      {
        // When approximation is being applied (m_bExactQuadrantPatch[fvi] is false and bEnableApproximatePatch is true),
        // This technique insures the approximations on either side of the crease 
        // create a continuous edge.
        ON_2dex Adex = ON_SubDQuadNeighborhood::GridDex(5, side_fvi, 1, 1);
        ON_2dex Bdex = ON_SubDQuadNeighborhood::GridDex(5, side_fvi, 1, 2);
        for (i = 0; i < 3; i++)
        {
          const double* A = m_srf_cv1[Adex.i][Adex.j];
          const double* B = m_srf_cv1[Bdex.i][Bdex.j];
          Q[i][0] = 2.0*A[0] - B[0];
          Q[i][1] = 2.0*A[1] - B[1];
          Q[i][2] = 2.0*A[2] - B[2];
          Adex.i += deltadex.i;
          Adex.j += deltadex.j;
          Bdex.i += deltadex.i;
          Bdex.j += deltadex.j;
        }
      }
      else if ( (m_bExactQuadrantPatch[fvi] || subdivision_count >= 2) && m_center_edges[side_fvi]->IsSmoothNotX() )
      {
        const ON_SubDEdge* edge = m_edge_grid[side_fvi][0];
        if (nullptr == edge)
        {
          if (m_bExactQuadrantPatch[fvi])
            return ON_SUBD_RETURN_ERROR(0);
          Q[0][0] = ON_UNSET_VALUE;
        }
        else if (!edge->GetSubdivisionPoint(Q[0]))
          return ON_SUBD_RETURN_ERROR(0);

        const ON_2dex fdex = ON_SubDQuadNeighborhood::GridDex(3, side_fvi, 1, 0);
        face = m_face_grid[fdex.i][fdex.j];
        if (nullptr == face)
        {
          if (m_bExactQuadrantPatch[fvi])
            return ON_SUBD_RETURN_ERROR(0);
          Q[1][0] = ON_UNSET_VALUE;
        }
        else if (!face->GetSubdivisionPoint(Q[1]))
          return ON_SUBD_RETURN_ERROR(0);

        edge = m_edge_grid[side_fvi][1];
        if (nullptr == edge)
        {
          if (m_bExactQuadrantPatch[fvi])
            return ON_SUBD_RETURN_ERROR(0);
          Q[2][0] = ON_UNSET_VALUE;
        }
        else if (!edge->GetSubdivisionPoint(Q[2]))
          return ON_SUBD_RETURN_ERROR(0);
      }
      else
      {
        // Need more subdivisions before these can be set.
        continue;
      }

      for (i = 0; i < 3; i++)
      {
        if (ON_IsValid(P1[i][0]))
        {
          ++set_cv_count;
          continue;
        }
        if (ON_IsValid(Q[i][0]))
        {
          ++set_cv_count;
          P1[i][0] = Q[i][0];
          P1[i][1] = Q[i][1];
          P1[i][2] = Q[i][2];
        }
      }
    }

    if (
      m_bExactQuadrantPatch[fvi] 
      ||
      (false == m_bExtraordinaryCornerVertex[fvi] && bEnableApproximatePatch))
    {
      dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 0, 0);
      P1[0] = &m_srf_cv1[dex.i][dex.j][0];
      if (ON_IsValid(P1[0][0]))
      {
        ++set_cv_count;
      }
      else
      {
        if ( center_vertices[fvi]->IsSmooth() )
        {
          if (4 == center_vertices[fvi]->m_edge_count && 4 == center_vertices[fvi]->m_face_count)
          {
            dex = ON_SubDQuadNeighborhood::GridDex(3, fvi, 0, 0);
            const ON_SubDFace* face_ij = m_face_grid[dex.i][dex.j];
            if (nullptr == face_ij)
              return ON_SUBD_RETURN_ERROR(0);
            if (!face_ij->GetSubdivisionPoint(Q[0]))
              return ON_SUBD_RETURN_ERROR(0);
            ++set_cv_count;
            P1[0][0] = Q[0][0]; P1[0][1] = Q[0][1]; P1[0][2] = Q[0][2];
          }
        }
        else  if (center_vertices[fvi]->IsCrease())
        {
          if (m_bBoundaryCrease[fvi] && m_bBoundaryCrease[fvi3])
          {
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 2, 1);
            Q[0][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[0][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[0][2] = m_srf_cv1[dex.i][dex.j][2];
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 1, 2);
            Q[1][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[1][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[1][2] = m_srf_cv1[dex.i][dex.j][2];
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 2, 2);
            Q[2][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[2][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[2][2] = m_srf_cv1[dex.i][dex.j][2];

            if (ON_IsValid(Q[0][0]) && ON_IsValid(Q[1][0]) && ON_IsValid(Q[2][0]))
            {
              dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 1, 1);
              if (ON_IsValid(m_srf_cv1[dex.i][dex.j][0]))
              {
                const double c = -8.0;
                const double b = 4.0;
                ++set_cv_count;
                P1[0][0] = c * m_srf_cv1[dex.i][dex.j][0] + b * (Q[0][0] + Q[1][0]) + Q[2][0];
                P1[0][1] = c * m_srf_cv1[dex.i][dex.j][1] + b * (Q[0][1] + Q[1][1]) + Q[2][1];
                P1[0][2] = c * m_srf_cv1[dex.i][dex.j][2] + b * (Q[0][2] + Q[1][2]) + Q[2][2];
              }
            }
          }
          else if (m_bBoundaryCrease[fvi] && false == m_bBoundaryCrease[fvi3])
          {
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 0, 1);
            Q[0][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[0][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[0][2] = m_srf_cv1[dex.i][dex.j][2];
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 0, 2);
            Q[1][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[1][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[1][2] = m_srf_cv1[dex.i][dex.j][2];

            if (ON_IsValid(Q[0][0]) && ON_IsValid(Q[1][0]))
            {
              ++set_cv_count;
              P1[0][0] = 2.0 * Q[0][0] - Q[1][0];
              P1[0][1] = 2.0 * Q[0][1] - Q[1][1];
              P1[0][2] = 2.0 * Q[0][2] - Q[1][2];
            }
          }
          else if (false == m_bBoundaryCrease[fvi] && m_bBoundaryCrease[fvi3])
          {
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 1, 0);
            Q[0][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[0][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[0][2] = m_srf_cv1[dex.i][dex.j][2];
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 2, 0);
            Q[1][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[1][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[1][2] = m_srf_cv1[dex.i][dex.j][2];

            if (ON_IsValid(Q[0][0]) && ON_IsValid(Q[1][0]))
            {
              ++set_cv_count;
              P1[0][0] = 2.0 * Q[0][0] - Q[1][0];
              P1[0][1] = 2.0 * Q[0][1] - Q[1][1];
              P1[0][2] = 2.0 * Q[0][2] - Q[1][2];
            }
          }
          else if (m_bExactQuadrantPatch[fvi])
          {
            ON_SUBD_ERROR("Why is this happening?");
          }
        }
      }
    }
    if (16 == set_cv_count)
    {
      // quadrant with index fvi is set;
      ++set_quadrant_count;
    }
  }

  if (exact_quadrant_count > set_quadrant_count)
    return ON_SUBD_RETURN_ERROR(set_quadrant_count);

  return set_quadrant_count;
}